

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

bool __thiscall sf::WindowBase::filterEvent(WindowBase *this,Event *event)

{
  int *in_RSI;
  long *in_RDI;
  
  if (*in_RSI == 1) {
    *(int *)(in_RDI + 2) = in_RSI[1];
    *(int *)((long)in_RDI + 0x14) = in_RSI[2];
    (**(code **)(*in_RDI + 0x30))();
  }
  return true;
}

Assistant:

bool WindowBase::filterEvent(const Event& event)
{
    // Notify resize events to the derived class
    if (event.type == Event::Resized)
    {
        // Cache the new size
        m_size.x = event.size.width;
        m_size.y = event.size.height;

        // Notify the derived class
        onResize();
    }

    return true;
}